

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.hpp
# Opt level: O2

ostream * test_detail::print_tuple_impl<std::tuple<int,int>,0ul,1ul>(ostream *stream,int *t)

{
  ostream *this;
  
  std::operator<<(stream,"(");
  std::ostream::operator<<(stream,t[1]);
  this = std::operator<<(stream,", ");
  std::ostream::operator<<(this,*t);
  std::operator<<(stream,")");
  return stream;
}

Assistant:

std::ostream & print_tuple_impl (std::ostream & stream, const Tuple & t, std::index_sequence<Head, Tail...>)
    {
        stream << "(";
        stream << std::get<Head>(t);
        auto x = {(stream << ", " << std::get<Tail>(t), 0)...};
        static_cast<void>(x);
        stream << ")";

        return stream;
    }